

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.cpp
# Opt level: O2

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::case0040(TypeCanonicalizerAndResolverTester *this)

{
  allocator<char> local_e1;
  string local_e0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "\nstruct {\n    struct {\n        struct c {\n            const int m ;\n        } ;\n    } ;\n} ;\nvoid _ ()\n{\n    struct c x ;\n}\n"
             ,&local_e1);
  Expectation::Expectation(&local_c0);
  canonicalizerAndResolveTypes(this,&local_e0,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void TypeCanonicalizerAndResolverTester::case0040()
{
    auto s = R"(
struct {
    struct {
        struct c {
            const int m ;
        } ;
    } ;
} ;
void _ ()
{
    struct c x ;
}
)";

    canonicalizerAndResolveTypes(s, Expectation());
}